

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O1

void __thiscall proto2_unittest::OneofWellKnownTypes::clear_oneof_field(OneofWellKnownTypes *this)

{
  long *plVar1;
  ulong uVar2;
  
  switch((this->field_0)._impl_._oneof_case_[0]) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
    uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar2 & 1) != 0) {
      uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
    }
    plVar1 = *(long **)&this->field_0;
    if (uVar2 == 0) {
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))();
      }
    }
    else if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x10))();
    }
  }
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void OneofWellKnownTypes::clear_oneof_field() {
// @@protoc_insertion_point(one_of_clear_start:proto2_unittest.OneofWellKnownTypes)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (oneof_field_case()) {
    case kAnyField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.any_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.any_field_);
      }
      break;
    }
    case kApiField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.api_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.api_field_);
      }
      break;
    }
    case kDurationField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.duration_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.duration_field_);
      }
      break;
    }
    case kEmptyField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.empty_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.empty_field_);
      }
      break;
    }
    case kFieldMaskField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.field_mask_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.field_mask_field_);
      }
      break;
    }
    case kSourceContextField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.source_context_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.source_context_field_);
      }
      break;
    }
    case kStructField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.struct_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.struct_field_);
      }
      break;
    }
    case kTimestampField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.timestamp_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.timestamp_field_);
      }
      break;
    }
    case kTypeField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.type_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.type_field_);
      }
      break;
    }
    case kDoubleField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.double_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.double_field_);
      }
      break;
    }
    case kFloatField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.float_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.float_field_);
      }
      break;
    }
    case kInt64Field: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.int64_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.int64_field_);
      }
      break;
    }
    case kUint64Field: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.uint64_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.uint64_field_);
      }
      break;
    }
    case kInt32Field: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.int32_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.int32_field_);
      }
      break;
    }
    case kUint32Field: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.uint32_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.uint32_field_);
      }
      break;
    }
    case kBoolField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.bool_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.bool_field_);
      }
      break;
    }
    case kStringField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.string_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.string_field_);
      }
      break;
    }
    case kBytesField: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.bytes_field_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.bytes_field_);
      }
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = ONEOF_FIELD_NOT_SET;
}